

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O2

void __thiscall
ScriptUtil_ExtractPubkeysFromMultisigScript_Test::TestBody
          (ScriptUtil_ExtractPubkeysFromMultisigScript_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_e0;
  AssertionResult gtest_ar_2;
  Script illegal_script;
  uint32_t reqnum;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_58;
  Script script;
  
  std::__cxx11::string::string
            ((string *)&illegal_script,
             "5e2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec521032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db21030dc96ba9b0dcce41a4b683164af15c045f0b169da1d1e234611a8cfc3195a1432102927b60e6bdbd728009e7e19feb4700a04f25328929730a609471b8e236ff050a2102ff43fd9fdb705d223951806f349dd2090edc4d971eb1c2a60c48cfb2af2862e72102ce1316489880a77407f9637af4e806c5a7e731b45504d6f3fca506b207f8e3c12102b12d700c4d851f773c55d17d9f59bf689a7cbdc01450c8679de9702fc77ac4f22103f6d4cfd7688da7a130ea0f6bd7ecaa6e7ae868ae8614cd746c26b1cb9e808e6021022ac6940d159cd39b36cb4a2ec34fb2696e085be634ce1e7b5fcc118a6ac5e2cc2102e9662b666479ed7117aa76fb96f322a84408d0882707b301c7450098d439680d2103c0230a322f70675bef21097242ac70647798826588e47eca14e5715cef77008c2102063566b61b4754dc2956b3571bdce889decc23c789d6b58df0057808b20e66d821033acbe038580c25da0c0c6e94c4dcbfa9c09f2f3bff59ae16aebfbd35a238a5572103a1423fc026f41f3f786db98a793802f77819e33692301ed24426e6dbad05aeaa2102818c3deec9c1f717cd6d97d2d9cf6cedfc9d97114fc6894ef71d4e1f69d859c45fae"
             ,(allocator *)&gtest_ar_2);
  cfd::core::Script::Script(&script,(string *)&illegal_script);
  std::__cxx11::string::~string((string *)&illegal_script);
  reqnum = 0;
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&illegal_script,
                 &script,&reqnum);
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::_M_move_assign
                (&pubkeys,&illegal_script);
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&illegal_script);
    }
  }
  else {
    testing::Message::Message((Message *)&illegal_script);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
               ,0x1f0,
               "Expected: pubkeys = ScriptUtil::ExtractPubkeysFromMultisigScript(script, &reqnum) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_2,(Message *)&illegal_script);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&illegal_script);
  }
  gtest_ar_2._0_8_ =
       ((long)pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
              _M_impl.super__Vector_impl_data._M_finish -
       (long)pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
             _M_impl.super__Vector_impl_data._M_start) / 0x18;
  local_e0.data_._0_4_ = 0xf;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&illegal_script,"pubkeys.size()","15",(unsigned_long *)&gtest_ar_2,
             (int *)&local_e0);
  if ((char)illegal_script._vptr_Script == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (illegal_script.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)illegal_script.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
               ,0x1f1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&illegal_script.script_data_);
  gtest_ar_2._0_4_ = 0xe;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&illegal_script,"reqnum","14",&reqnum,(int *)&gtest_ar_2);
  if ((char)illegal_script._vptr_Script == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (illegal_script.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)illegal_script.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
               ,0x1f2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&illegal_script.script_data_);
  if ((long)pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x168) {
    cfd::core::Pubkey::GetHex_abi_cxx11_
              ((string *)&illegal_script,
               pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_start);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,"pubkeys[0].GetHex().c_str()",
               "\"02be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5\"",
               (char *)CONCAT71(illegal_script._vptr_Script._1_7_,(char)illegal_script._vptr_Script)
               ,"02be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5");
    std::__cxx11::string::~string((string *)&illegal_script);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&illegal_script);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1f5,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&illegal_script);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&illegal_script);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::Pubkey::GetHex_abi_cxx11_
              ((string *)&illegal_script,
               pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_start + 1);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,"pubkeys[1].GetHex().c_str()",
               "\"032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db\"",
               (char *)CONCAT71(illegal_script._vptr_Script._1_7_,(char)illegal_script._vptr_Script)
               ,"032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db");
    std::__cxx11::string::~string((string *)&illegal_script);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&illegal_script);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1f7,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&illegal_script);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&illegal_script);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::Pubkey::GetHex_abi_cxx11_
              ((string *)&illegal_script,
               pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_start + 2);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,"pubkeys[2].GetHex().c_str()",
               "\"030dc96ba9b0dcce41a4b683164af15c045f0b169da1d1e234611a8cfc3195a143\"",
               (char *)CONCAT71(illegal_script._vptr_Script._1_7_,(char)illegal_script._vptr_Script)
               ,"030dc96ba9b0dcce41a4b683164af15c045f0b169da1d1e234611a8cfc3195a143");
    std::__cxx11::string::~string((string *)&illegal_script);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&illegal_script);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1f9,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&illegal_script);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&illegal_script);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::Pubkey::GetHex_abi_cxx11_
              ((string *)&illegal_script,
               pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_start + 3);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,"pubkeys[3].GetHex().c_str()",
               "\"02927b60e6bdbd728009e7e19feb4700a04f25328929730a609471b8e236ff050a\"",
               (char *)CONCAT71(illegal_script._vptr_Script._1_7_,(char)illegal_script._vptr_Script)
               ,"02927b60e6bdbd728009e7e19feb4700a04f25328929730a609471b8e236ff050a");
    std::__cxx11::string::~string((string *)&illegal_script);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&illegal_script);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1fb,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&illegal_script);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&illegal_script);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::Pubkey::GetHex_abi_cxx11_
              ((string *)&illegal_script,
               pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_start + 4);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,"pubkeys[4].GetHex().c_str()",
               "\"02ff43fd9fdb705d223951806f349dd2090edc4d971eb1c2a60c48cfb2af2862e7\"",
               (char *)CONCAT71(illegal_script._vptr_Script._1_7_,(char)illegal_script._vptr_Script)
               ,"02ff43fd9fdb705d223951806f349dd2090edc4d971eb1c2a60c48cfb2af2862e7");
    std::__cxx11::string::~string((string *)&illegal_script);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&illegal_script);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1fd,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&illegal_script);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&illegal_script);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::Pubkey::GetHex_abi_cxx11_
              ((string *)&illegal_script,
               pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_start + 5);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,"pubkeys[5].GetHex().c_str()",
               "\"02ce1316489880a77407f9637af4e806c5a7e731b45504d6f3fca506b207f8e3c1\"",
               (char *)CONCAT71(illegal_script._vptr_Script._1_7_,(char)illegal_script._vptr_Script)
               ,"02ce1316489880a77407f9637af4e806c5a7e731b45504d6f3fca506b207f8e3c1");
    std::__cxx11::string::~string((string *)&illegal_script);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&illegal_script);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1ff,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&illegal_script);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&illegal_script);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::Pubkey::GetHex_abi_cxx11_
              ((string *)&illegal_script,
               pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_start + 6);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,"pubkeys[6].GetHex().c_str()",
               "\"02b12d700c4d851f773c55d17d9f59bf689a7cbdc01450c8679de9702fc77ac4f2\"",
               (char *)CONCAT71(illegal_script._vptr_Script._1_7_,(char)illegal_script._vptr_Script)
               ,"02b12d700c4d851f773c55d17d9f59bf689a7cbdc01450c8679de9702fc77ac4f2");
    std::__cxx11::string::~string((string *)&illegal_script);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&illegal_script);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x201,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&illegal_script);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&illegal_script);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::Pubkey::GetHex_abi_cxx11_
              ((string *)&illegal_script,
               pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_start + 7);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,"pubkeys[7].GetHex().c_str()",
               "\"03f6d4cfd7688da7a130ea0f6bd7ecaa6e7ae868ae8614cd746c26b1cb9e808e60\"",
               (char *)CONCAT71(illegal_script._vptr_Script._1_7_,(char)illegal_script._vptr_Script)
               ,"03f6d4cfd7688da7a130ea0f6bd7ecaa6e7ae868ae8614cd746c26b1cb9e808e60");
    std::__cxx11::string::~string((string *)&illegal_script);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&illegal_script);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x203,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&illegal_script);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&illegal_script);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::Pubkey::GetHex_abi_cxx11_
              ((string *)&illegal_script,
               pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_start + 8);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,"pubkeys[8].GetHex().c_str()",
               "\"022ac6940d159cd39b36cb4a2ec34fb2696e085be634ce1e7b5fcc118a6ac5e2cc\"",
               (char *)CONCAT71(illegal_script._vptr_Script._1_7_,(char)illegal_script._vptr_Script)
               ,"022ac6940d159cd39b36cb4a2ec34fb2696e085be634ce1e7b5fcc118a6ac5e2cc");
    std::__cxx11::string::~string((string *)&illegal_script);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&illegal_script);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x205,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&illegal_script);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&illegal_script);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::Pubkey::GetHex_abi_cxx11_
              ((string *)&illegal_script,
               pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_start + 9);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,"pubkeys[9].GetHex().c_str()",
               "\"02e9662b666479ed7117aa76fb96f322a84408d0882707b301c7450098d439680d\"",
               (char *)CONCAT71(illegal_script._vptr_Script._1_7_,(char)illegal_script._vptr_Script)
               ,"02e9662b666479ed7117aa76fb96f322a84408d0882707b301c7450098d439680d");
    std::__cxx11::string::~string((string *)&illegal_script);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&illegal_script);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x207,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&illegal_script);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&illegal_script);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::Pubkey::GetHex_abi_cxx11_
              ((string *)&illegal_script,
               pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_start + 10);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,"pubkeys[10].GetHex().c_str()",
               "\"03c0230a322f70675bef21097242ac70647798826588e47eca14e5715cef77008c\"",
               (char *)CONCAT71(illegal_script._vptr_Script._1_7_,(char)illegal_script._vptr_Script)
               ,"03c0230a322f70675bef21097242ac70647798826588e47eca14e5715cef77008c");
    std::__cxx11::string::~string((string *)&illegal_script);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&illegal_script);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x209,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&illegal_script);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&illegal_script);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::Pubkey::GetHex_abi_cxx11_
              ((string *)&illegal_script,
               pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_start + 0xb);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,"pubkeys[11].GetHex().c_str()",
               "\"02063566b61b4754dc2956b3571bdce889decc23c789d6b58df0057808b20e66d8\"",
               (char *)CONCAT71(illegal_script._vptr_Script._1_7_,(char)illegal_script._vptr_Script)
               ,"02063566b61b4754dc2956b3571bdce889decc23c789d6b58df0057808b20e66d8");
    std::__cxx11::string::~string((string *)&illegal_script);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&illegal_script);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x20b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&illegal_script);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&illegal_script);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::Pubkey::GetHex_abi_cxx11_
              ((string *)&illegal_script,
               pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_start + 0xc);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,"pubkeys[12].GetHex().c_str()",
               "\"033acbe038580c25da0c0c6e94c4dcbfa9c09f2f3bff59ae16aebfbd35a238a557\"",
               (char *)CONCAT71(illegal_script._vptr_Script._1_7_,(char)illegal_script._vptr_Script)
               ,"033acbe038580c25da0c0c6e94c4dcbfa9c09f2f3bff59ae16aebfbd35a238a557");
    std::__cxx11::string::~string((string *)&illegal_script);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&illegal_script);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x20d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&illegal_script);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&illegal_script);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::Pubkey::GetHex_abi_cxx11_
              ((string *)&illegal_script,
               pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_start + 0xd);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,"pubkeys[13].GetHex().c_str()",
               "\"03a1423fc026f41f3f786db98a793802f77819e33692301ed24426e6dbad05aeaa\"",
               (char *)CONCAT71(illegal_script._vptr_Script._1_7_,(char)illegal_script._vptr_Script)
               ,"03a1423fc026f41f3f786db98a793802f77819e33692301ed24426e6dbad05aeaa");
    std::__cxx11::string::~string((string *)&illegal_script);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&illegal_script);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x20f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&illegal_script);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&illegal_script);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::Pubkey::GetHex_abi_cxx11_
              ((string *)&illegal_script,
               pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_start + 0xe);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,"pubkeys[14].GetHex().c_str()",
               "\"02818c3deec9c1f717cd6d97d2d9cf6cedfc9d97114fc6894ef71d4e1f69d859c4\"",
               (char *)CONCAT71(illegal_script._vptr_Script._1_7_,(char)illegal_script._vptr_Script)
               ,"02818c3deec9c1f717cd6d97d2d9cf6cedfc9d97114fc6894ef71d4e1f69d859c4");
    std::__cxx11::string::~string((string *)&illegal_script);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&illegal_script);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x211,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&illegal_script);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&illegal_script);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
  }
  std::__cxx11::string::string
            ((string *)&gtest_ar_2,
             "210279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798ac",
             (allocator *)&local_e0);
  cfd::core::Script::Script(&illegal_script,(string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript(&local_58,&illegal_script,&reqnum);
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_58);
  }
  testing::Message::Message((Message *)&gtest_ar_2);
  testing::internal::AssertHelper::AssertHelper
            (&local_e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
             ,0x216,
             "Expected: ScriptUtil::ExtractPubkeysFromMultisigScript(illegal_script, &reqnum) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_e0,(Message *)&gtest_ar_2);
  testing::internal::AssertHelper::~AssertHelper(&local_e0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_2);
  cfd::core::Script::~Script(&illegal_script);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&pubkeys);
  cfd::core::Script::~Script(&script);
  return;
}

Assistant:

TEST(ScriptUtil, ExtractPubkeysFromMultisigScript) {
  // valid script data
  Script script("5e2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec521032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db21030dc96ba9b0dcce41a4b683164af15c045f0b169da1d1e234611a8cfc3195a1432102927b60e6bdbd728009e7e19feb4700a04f25328929730a609471b8e236ff050a2102ff43fd9fdb705d223951806f349dd2090edc4d971eb1c2a60c48cfb2af2862e72102ce1316489880a77407f9637af4e806c5a7e731b45504d6f3fca506b207f8e3c12102b12d700c4d851f773c55d17d9f59bf689a7cbdc01450c8679de9702fc77ac4f22103f6d4cfd7688da7a130ea0f6bd7ecaa6e7ae868ae8614cd746c26b1cb9e808e6021022ac6940d159cd39b36cb4a2ec34fb2696e085be634ce1e7b5fcc118a6ac5e2cc2102e9662b666479ed7117aa76fb96f322a84408d0882707b301c7450098d439680d2103c0230a322f70675bef21097242ac70647798826588e47eca14e5715cef77008c2102063566b61b4754dc2956b3571bdce889decc23c789d6b58df0057808b20e66d821033acbe038580c25da0c0c6e94c4dcbfa9c09f2f3bff59ae16aebfbd35a238a5572103a1423fc026f41f3f786db98a793802f77819e33692301ed24426e6dbad05aeaa2102818c3deec9c1f717cd6d97d2d9cf6cedfc9d97114fc6894ef71d4e1f69d859c45fae");
  uint32_t reqnum = 0;
  std::vector<Pubkey> pubkeys;
  EXPECT_NO_THROW(pubkeys = ScriptUtil::ExtractPubkeysFromMultisigScript(script, &reqnum));
  EXPECT_EQ(pubkeys.size(), 15);
  EXPECT_EQ(reqnum, 14);
  if (pubkeys.size() == 15) {
    EXPECT_STREQ(pubkeys[0].GetHex().c_str(),
        "02be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5");
    EXPECT_STREQ(pubkeys[1].GetHex().c_str(),
        "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db");
    EXPECT_STREQ(pubkeys[2].GetHex().c_str(),
        "030dc96ba9b0dcce41a4b683164af15c045f0b169da1d1e234611a8cfc3195a143");
    EXPECT_STREQ(pubkeys[3].GetHex().c_str(),
        "02927b60e6bdbd728009e7e19feb4700a04f25328929730a609471b8e236ff050a");
    EXPECT_STREQ(pubkeys[4].GetHex().c_str(),
        "02ff43fd9fdb705d223951806f349dd2090edc4d971eb1c2a60c48cfb2af2862e7");
    EXPECT_STREQ(pubkeys[5].GetHex().c_str(),
        "02ce1316489880a77407f9637af4e806c5a7e731b45504d6f3fca506b207f8e3c1");
    EXPECT_STREQ(pubkeys[6].GetHex().c_str(),
        "02b12d700c4d851f773c55d17d9f59bf689a7cbdc01450c8679de9702fc77ac4f2");
    EXPECT_STREQ(pubkeys[7].GetHex().c_str(),
        "03f6d4cfd7688da7a130ea0f6bd7ecaa6e7ae868ae8614cd746c26b1cb9e808e60");
    EXPECT_STREQ(pubkeys[8].GetHex().c_str(),
        "022ac6940d159cd39b36cb4a2ec34fb2696e085be634ce1e7b5fcc118a6ac5e2cc");
    EXPECT_STREQ(pubkeys[9].GetHex().c_str(),
        "02e9662b666479ed7117aa76fb96f322a84408d0882707b301c7450098d439680d");
    EXPECT_STREQ(pubkeys[10].GetHex().c_str(),
        "03c0230a322f70675bef21097242ac70647798826588e47eca14e5715cef77008c");
    EXPECT_STREQ(pubkeys[11].GetHex().c_str(),
        "02063566b61b4754dc2956b3571bdce889decc23c789d6b58df0057808b20e66d8");
    EXPECT_STREQ(pubkeys[12].GetHex().c_str(),
        "033acbe038580c25da0c0c6e94c4dcbfa9c09f2f3bff59ae16aebfbd35a238a557");
    EXPECT_STREQ(pubkeys[13].GetHex().c_str(),
        "03a1423fc026f41f3f786db98a793802f77819e33692301ed24426e6dbad05aeaa");
    EXPECT_STREQ(pubkeys[14].GetHex().c_str(),
        "02818c3deec9c1f717cd6d97d2d9cf6cedfc9d97114fc6894ef71d4e1f69d859c4");
  }

  Script illegal_script("210279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798ac");
  EXPECT_THROW(ScriptUtil::ExtractPubkeysFromMultisigScript(illegal_script, &reqnum),
      CfdException);
}